

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O3

string * efsw::FileSystem::getLinkRealPath
                   (string *__return_storage_ptr__,string *dir,string *curPath)

{
  pointer pcVar1;
  bool bVar2;
  FileInfo fi;
  string local_a8;
  string local_88;
  FileInfo local_68;
  
  dirRemoveSlashAtEnd(dir);
  FileInfo::FileInfo(&local_68,dir,true);
  bVar2 = FileInfo::isLink(&local_68);
  if (bVar2) {
    FileInfo::linksTo_abi_cxx11_(__return_storage_ptr__,&local_68);
    pcVar1 = (dir->_M_dataplus)._M_p;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar1,pcVar1 + dir->_M_string_length);
    pathRemoveFileName(&local_88,&local_a8);
    std::__cxx11::string::operator=((string *)curPath,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    dirAddSlashAtEnd(__return_storage_ptr__);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.Filepath._M_dataplus._M_p != &local_68.Filepath.field_2) {
    operator_delete(local_68.Filepath._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileSystem::getLinkRealPath( std::string dir, std::string& curPath ) {
	FileSystem::dirRemoveSlashAtEnd( dir );
	FileInfo fi( dir, true );

	/// Check with lstat and see if it's a link
	if ( fi.isLink() ) {
		/// get the real path of the link
		std::string link( fi.linksTo() );

		/// get the current path of the directory without the link dir path
		curPath = FileSystem::pathRemoveFileName( dir );

		/// ensure that ends with the os directory slash
		FileSystem::dirAddSlashAtEnd( link );

		return link;
	}

	/// if it's not a link return nothing
	return "";
}